

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider_p.h
# Opt level: O2

void __thiscall QMimeProviderBase::~QMimeProviderBase(QMimeProviderBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~QMimeProviderBase() = default;